

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentSizeTextureCase::testColorAttachment
          (UnspecifiedAttachmentSizeTextureCase *this)

{
  CallLogWrapper *this_00;
  uint in_EAX;
  int s;
  ulong uStack_28;
  GLuint textureID;
  
  uStack_28 = (ulong)in_EAX;
  this_00 = &(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&textureID);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,textureID);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,textureID,0);
  s = 0x622238;
  ApiCase::expectError((ApiCase *)this,0);
  checkAttachmentComponentSizeExactly
            ((this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_TestCase.super_TestCase
             .super_TestNode.m_testCtx,this_00,0x8ce0,0,0,0,0,0,0,s);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&textureID);
  return;
}

Assistant:

void testColorAttachment (void)
	{
		GLuint textureID = 0;
		glGenTextures(1, &textureID);
		glBindTexture(GL_TEXTURE_2D, textureID);
		expectError(GL_NO_ERROR);

		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, 0);
		expectError(GL_NO_ERROR);

		checkAttachmentComponentSizeExactly	(m_testCtx, *this, GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, 0, 0, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
		glDeleteTextures(1, &textureID);
	}